

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O3

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::AddMultisigSign
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,ConfidentialTxInReference *txin,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          AddressType address_type,Script *witness_script,Script redeem_script,bool clear_stack)

{
  uint32_t vout;
  Txid local_88;
  Script local_68;
  
  cfd::core::Txid::Txid(&local_88,&(txin->super_AbstractTxInReference).txid_);
  vout = (txin->super_AbstractTxInReference).vout_;
  cfd::core::Script::Script(&local_68,(Script *)redeem_script._vptr_Script);
  AddMultisigSign(__return_storage_ptr__,(ElementsTransactionApi *)redeem_script._vptr_Script,tx_hex
                  ,&local_88,vout,sign_list,address_type,witness_script,&local_68,
                  redeem_script.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_);
  core::Script::~Script(&local_68);
  local_88._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
  if (local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::AddMultisigSign(
    const std::string& tx_hex, const ConfidentialTxInReference& txin,
    const std::vector<SignParameter>& sign_list, AddressType address_type,
    const Script& witness_script, const Script redeem_script,
    bool clear_stack) {
  return AddMultisigSign(
      tx_hex, txin.GetTxid(), txin.GetVout(), sign_list, address_type,
      witness_script, redeem_script, clear_stack);
}